

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall
yy::parser::context::expected_tokens(context *this,symbol_kind_type *yyarg,int yyargn)

{
  parser *this_00;
  bool bVar1;
  symbol_kind_type yytoken;
  symbol_kind_type local_2c;
  symbol_kind_type yysym;
  int yyx;
  int yycount;
  int yyargn_local;
  symbol_kind_type *yyarg_local;
  context *this_local;
  
  yysym = S_YYEOF;
  if ((this->yyparser_->yy_lac_established_ & 1U) == 0) {
    this_00 = this->yyparser_;
    yytoken = by_kind::kind((by_kind *)this->yyla_);
    yy_lac_check_(this_00,yytoken);
  }
  local_2c = S_YYEOF;
  do {
    if (S_UNQUOTED_STR < local_2c) {
      if (((yyarg != (symbol_kind_type *)0x0) && (yysym == S_YYEOF)) && (0 < yyargn)) {
        *yyarg = S_YYEMPTY;
      }
      return yysym;
    }
    if (((local_2c != S_YYerror) && (local_2c != S_YYUNDEF)) &&
       (bVar1 = yy_lac_check_(this->yyparser_,local_2c), bVar1)) {
      if (yyarg != (symbol_kind_type *)0x0) {
        if (yysym == yyargn) {
          return 0;
        }
        yyarg[yysym] = local_2c;
      }
      yysym = yysym + S_YYerror;
    }
    local_2c = local_2c + S_YYerror;
  } while( true );
}

Assistant:

int
  parser::context::expected_tokens (symbol_kind_type yyarg[], int yyargn) const
  {
    // Actual number of expected tokens
    int yycount = 0;

#if YYDEBUG
    // Execute LAC once. We don't care if it is successful, we
    // only do it for the sake of debugging output.
    if (!yyparser_.yy_lac_established_)
      yyparser_.yy_lac_check_ (yyla_.kind ());
#endif

    for (int yyx = 0; yyx < YYNTOKENS; ++yyx)
      {
        symbol_kind_type yysym = YY_CAST (symbol_kind_type, yyx);
        if (yysym != symbol_kind::S_YYerror
            && yysym != symbol_kind::S_YYUNDEF
            && yyparser_.yy_lac_check_ (yysym))
          {
            if (!yyarg)
              ++yycount;
            else if (yycount == yyargn)
              return 0;
            else
              yyarg[yycount++] = yysym;
          }
      }
    if (yyarg && yycount == 0 && 0 < yyargn)
      yyarg[0] = symbol_kind::S_YYEMPTY;
    return yycount;
  }